

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O1

void __thiscall
Args::OnlyOneGroup::checkCorrectnessBeforeParsing
          (OnlyOneGroup *this,StringList *flags,StringList *names)

{
  pointer puVar1;
  ArgIface *pAVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  logic_error *this_00;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar9;
  ulong *local_110;
  undefined8 local_100;
  undefined8 uStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->super_GroupIface).m_children.
                super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    pAVar2 = (puVar9->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    (*pAVar2->_vptr_ArgIface[0x10])(pAVar2,flags,names);
  }
  puVar9 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar9 == puVar1) {
      return;
    }
    iVar5 = (*((puVar9->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[5])();
    if ((char)iVar5 != '\0') break;
    puVar9 = puVar9 + 1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Required argument \"","");
  (*((puVar9->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
     _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
     super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[3])(&local_90);
  std::operator+(&local_70,&local_b0,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_4_ = (undefined4)plVar6[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar3 = (this->super_GroupIface).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (this->super_GroupIface).m_name._M_string_length);
  std::operator+(&local_50,&local_f0,&local_d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_110 = (ulong *)*plVar6;
  puVar8 = (ulong *)(plVar6 + 2);
  if (local_110 == puVar8) {
    local_100 = *puVar8;
    uStack_f8 = plVar6[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar8;
  }
  lVar4 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_00137920;
  *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
  if (local_110 == &local_100) {
    *(undefined4 *)(this_00 + 0x20) = (undefined4)local_100;
    *(undefined4 *)(this_00 + 0x24) = local_100._4_4_;
    *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_f8;
    *(undefined4 *)(this_00 + 0x2c) = uStack_f8._4_4_;
  }
  else {
    *(ulong **)(this_00 + 0x10) = local_110;
    *(ulong *)(this_00 + 0x20) = local_100;
  }
  *(long *)(this_00 + 0x18) = lVar4;
  local_100 = local_100 & 0xffffffffffffff00;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		GroupIface::checkCorrectnessBeforeParsing( flags, names );

		for( const auto & arg : details::asConst( children() ) )
		{
			if( arg->isRequired() )
				throw BaseException( String( SL( "Required argument \"" ) ) +
					arg->name() +
					SL( "\" is not allowed to be in OnlyOne group \"" ) +
					name() + SL( "\"." ) );
		}
	}